

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeArrayGet(TranslateToFuzzReader *this,Type type)

{
  ArrayGet *ifTrue;
  bool bVar1;
  value_type *pvVar2;
  Expression *ifFalse;
  optional<wasm::Type> type_00;
  optional<wasm::Type> local_c0;
  TranslateToFuzzReader *local_b0;
  Expression *local_a8;
  Expression *fallback;
  ArrayGet *local_98;
  ArrayGet *get;
  BoundsCheck check;
  Field local_68;
  byte local_51;
  Type TStack_50;
  bool signed_;
  Expression *local_48;
  Expression *index;
  Expression *local_38;
  Expression *ref;
  value_type arrayType;
  mapped_type *arrays;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  this_local = (TranslateToFuzzReader *)type.id;
  arrayType.id = (uintptr_t)
                 std::
                 unordered_map<wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>
                 ::operator[](&this->typeArrays,(key_type *)&this_local);
  bVar1 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::empty
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)arrayType.id);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar2 = pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this,(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)arrayType.id
                       );
    index = (Expression *)pvVar2->id;
    ref = index;
    local_38 = makeTrappingRefUse(this,(HeapType)index);
    Type::Type(&stack0xffffffffffffffb0,i32);
    local_48 = make(this,TStack_50);
    wasm::HeapType::getArray();
    local_51 = maybeSignedGet(this,&local_68);
    if (((this->allowOOB & 1U) == 0) || (bVar1 = oneIn(this,10), !bVar1)) {
      makeArrayBoundsCheck
                ((BoundsCheck *)&get,local_38,local_48,this->funcContext->func,&this->builder,
                 (Expression *)0x0);
      fallback = (Expression *)this_local;
      local_98 = Builder::makeArrayGet
                           (&this->builder,check.condition,check.getRef,(Type)this_local,
                            (bool)(local_51 & 1));
      local_b0 = this_local;
      ifFalse = makeTrivial(this,(Type)this_local);
      ifTrue = local_98;
      local_a8 = ifFalse;
      std::optional<wasm::Type>::optional(&local_c0);
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_7_ = 0;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           local_c0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_payload;
      type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged =
           local_c0.super__Optional_base<wasm::Type,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Type>._M_engaged;
      type_local.id =
           (uintptr_t)
           Builder::makeIf(&this->builder,(Expression *)get,(Expression *)ifTrue,ifFalse,type_00);
    }
    else {
      check.getLength = (Expression *)this_local;
      type_local.id =
           (uintptr_t)
           Builder::makeArrayGet
                     (&this->builder,local_38,local_48,(Type)this_local,(bool)(local_51 & 1));
    }
    return (Expression *)type_local.id;
  }
  __assert_fail("!arrays.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x13aa,"Expression *wasm::TranslateToFuzzReader::makeArrayGet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeArrayGet(Type type) {
  auto& arrays = typeArrays[type];
  assert(!arrays.empty());
  auto arrayType = pick(arrays);
  auto* ref = makeTrappingRefUse(arrayType);
  auto* index = make(Type::i32);
  auto signed_ = maybeSignedGet(arrayType.getArray().element);
  // Only rarely emit a plain get which might trap. See related logic in
  // ::makePointer().
  if (allowOOB && oneIn(10)) {
    return builder.makeArrayGet(ref, index, type, signed_);
  }
  // To avoid a trap, check the length dynamically using this pattern:
  //
  //   index < array.len ? array[index] : ..some fallback value..
  //
  auto check = makeArrayBoundsCheck(ref, index, funcContext->func, builder);
  auto* get = builder.makeArrayGet(check.getRef, check.getIndex, type, signed_);
  auto* fallback = makeTrivial(type);
  return builder.makeIf(check.condition, get, fallback);
}